

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O3

void __thiscall TrivialRETest_Runnings_Test::TestBody(TrivialRETest_Runnings_Test *this)

{
  pointer *ppvVar1;
  void *pvVar2;
  ulong uVar3;
  bool bVar4;
  internal iVar5;
  pointer pbVar6;
  undefined8 uVar7;
  long lVar8;
  undefined1 auVar9 [8];
  size_t sVar10;
  pointer pvVar11;
  undefined8 *puVar12;
  size_t *psVar13;
  iterator pbVar14;
  pointer *ppvVar15;
  basic_string_view<char,_std::char_traits<char>_> *pbVar16;
  char *in_R9;
  char *pcVar17;
  ulong uVar18;
  byte bVar19;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_17;
  initializer_list<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  __l_18;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> local_7a8 [6];
  basic_string_view<char,_std::char_traits<char>_> local_748 [6];
  basic_string_view<char,_std::char_traits<char>_> local_6e8 [5];
  basic_string_view<char,_std::char_traits<char>_> local_698 [5];
  basic_string_view<char,_std::char_traits<char>_> local_648 [5];
  basic_string_view<char,_std::char_traits<char>_> local_5f8;
  undefined8 local_5e8;
  char *pcStack_5e0;
  undefined8 local_5d8;
  char *pcStack_5d0;
  undefined8 local_5c8;
  char *pcStack_5c0;
  basic_string_view<char,_std::char_traits<char>_> local_5b8;
  undefined8 local_5a8;
  char *pcStack_5a0;
  undefined8 local_598;
  char *pcStack_590;
  undefined8 local_588;
  char *pcStack_580;
  basic_string_view<char,_std::char_traits<char>_> local_578;
  undefined8 local_568;
  char *pcStack_560;
  undefined8 local_558;
  char *pcStack_550;
  undefined8 local_548;
  char *pcStack_540;
  basic_string_view<char,_std::char_traits<char>_> local_538;
  undefined8 local_528;
  char *pcStack_520;
  undefined8 local_518;
  char *pcStack_510;
  undefined8 local_508;
  char *pcStack_500;
  basic_string_view<char,_std::char_traits<char>_> local_4f8;
  undefined8 local_4e8;
  char *pcStack_4e0;
  undefined8 local_4d8;
  char *pcStack_4d0;
  undefined8 local_4c8;
  char *pcStack_4c0;
  basic_string_view<char,_std::char_traits<char>_> local_4b8;
  undefined8 local_4a8;
  char *pcStack_4a0;
  undefined8 local_498;
  char *pcStack_490;
  undefined8 local_488;
  char *pcStack_480;
  basic_string_view<char,_std::char_traits<char>_> local_478;
  undefined8 local_468;
  char *pcStack_460;
  undefined8 local_458;
  char *pcStack_450;
  basic_string_view<char,_std::char_traits<char>_> local_448;
  undefined8 local_438;
  char *pcStack_430;
  undefined8 local_428;
  char *pcStack_420;
  basic_string_view<char,_std::char_traits<char>_> local_418;
  undefined8 local_408;
  char *pcStack_400;
  undefined8 local_3f8;
  char *pcStack_3f0;
  basic_string_view<char,_std::char_traits<char>_> local_3e8;
  undefined8 local_3d8;
  char *pcStack_3d0;
  basic_string_view<char,_std::char_traits<char>_> local_3c8 [6];
  undefined1 local_368 [8];
  Matcher m;
  long local_320 [3];
  undefined1 local_308 [16];
  undefined1 local_2f8 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2f0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2d8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2c0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_2a8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_290;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_278;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_260;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_248;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_230;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_218;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_200;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1e8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1d0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1b8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1a0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_188;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_170;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_158;
  undefined1 local_140 [8];
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  cases2;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [5];
  pointer local_60;
  char *local_58;
  pointer local_50;
  allocator_type local_44;
  allocator_type local_43;
  allocator_type local_42;
  allocator_type local_41;
  allocator_type local_40;
  allocator_type local_3f;
  allocator_type local_3e;
  allocator_type local_3d;
  allocator_type local_3c;
  allocator_type local_3b;
  allocator_type local_3a;
  allocator_type local_39;
  allocator_type local_38;
  allocator_type local_37;
  allocator_type local_36;
  allocator_type local_35;
  allocator_type local_34;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  bVar19 = 0;
  local_5c8 = 4;
  pcStack_5c0 = "+not";
  local_5d8 = 1;
  pcStack_5d0 = "+";
  local_5e8 = 2;
  pcStack_5e0 = "+a";
  local_5f8._M_len = 2;
  local_5f8._M_str = "a*";
  __l._M_len = 4;
  __l._M_array = &local_5f8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)local_308,__l,&local_44);
  psVar13 = &DAT_0015a580;
  pbVar16 = local_6e8;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pbVar16->_M_len = *psVar13;
    psVar13 = psVar13 + (ulong)bVar19 * -2 + 1;
    pbVar16 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar16[-(ulong)bVar19]._M_str;
  }
  __l_00._M_len = 5;
  __l_00._M_array = local_6e8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2f0,__l_00,&local_43);
  psVar13 = &DAT_0015a5d0;
  pbVar14 = (iterator)local_368;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    pbVar14->_M_len = *psVar13;
    psVar13 = psVar13 + (ulong)bVar19 * -2 + 1;
    pbVar14 = (iterator)&pbVar14[-(ulong)bVar19]._M_str;
  }
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)local_368;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2d8,__l_01,&local_42);
  local_588 = 1;
  pcStack_580 = "-";
  local_598 = 2;
  pcStack_590 = "+a";
  local_5a8 = 2;
  pcStack_5a0 = "-\n";
  local_5b8._M_len = 1;
  local_5b8._M_str = ".";
  __l_02._M_len = 4;
  __l_02._M_array = &local_5b8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2c0,__l_02,&local_41);
  psVar13 = &DAT_0015a670;
  pbVar14 = (iterator)local_c0;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    pbVar14->_M_len = *psVar13;
    psVar13 = psVar13 + (ulong)bVar19 * -2 + 1;
    pbVar14 = (iterator)&pbVar14[-(ulong)bVar19]._M_str;
  }
  __l_03._M_len = 6;
  __l_03._M_array = (iterator)local_c0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_2a8,__l_03,&local_40);
  ppvVar1 = &cases2.
             super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar12 = &DAT_0015a6d0;
  ppvVar15 = ppvVar1;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    *ppvVar15 = (pointer)*puVar12;
    puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
    ppvVar15 = ppvVar15 + (ulong)bVar19 * -2 + 1;
  }
  __l_04._M_len = 6;
  __l_04._M_array = (iterator)ppvVar1;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_290,__l_04,&local_3f);
  local_548 = 2;
  pcStack_540 = "+z";
  local_558 = 2;
  pcStack_550 = "-b";
  local_568 = 2;
  pcStack_560 = "+a";
  local_578._M_len = 4;
  local_578._M_str = "[az]";
  __l_05._M_len = 4;
  __l_05._M_array = &local_578;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_278,__l_05,&local_3e);
  psVar13 = &DAT_0015a770;
  pbVar16 = local_698;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pbVar16->_M_len = *psVar13;
    psVar13 = psVar13 + (ulong)bVar19 * -2 + 1;
    pbVar16 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar16[-(ulong)bVar19]._M_str;
  }
  __l_06._M_len = 5;
  __l_06._M_array = local_698;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_260,__l_06,&local_3d);
  psVar13 = &DAT_0015a7c0;
  pbVar16 = local_3c8;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    pbVar16->_M_len = *psVar13;
    psVar13 = psVar13 + (ulong)bVar19 * -2 + 1;
    pbVar16 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar16[-(ulong)bVar19]._M_str;
  }
  __l_07._M_len = 6;
  __l_07._M_array = local_3c8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_248,__l_07,&local_3c);
  psVar13 = &DAT_0015a820;
  pbVar16 = local_648;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pbVar16->_M_len = *psVar13;
    psVar13 = psVar13 + (ulong)bVar19 * -2 + 1;
    pbVar16 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar16[-(ulong)bVar19]._M_str;
  }
  __l_08._M_len = 5;
  __l_08._M_array = local_648;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_230,__l_08,&local_3b);
  local_458 = 2;
  pcStack_450 = "+\n";
  local_468 = 2;
  pcStack_460 = "+a";
  local_478._M_len = 3;
  local_478._M_str = "[^]";
  __l_09._M_len = 3;
  __l_09._M_array = &local_478;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_218,__l_09,&local_3a);
  local_428 = 7;
  pcStack_420 = "+asdasd";
  local_438 = 1;
  pcStack_430 = "+";
  local_448._M_len = 0;
  local_448._M_str = "";
  __l_10._M_len = 3;
  __l_10._M_array = &local_448;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_200,__l_10,&local_39);
  psVar13 = &DAT_0015a8d0;
  pbVar16 = local_7a8;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    pbVar16->_M_len = *psVar13;
    psVar13 = psVar13 + (ulong)bVar19 * -2 + 1;
    pbVar16 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar16[-(ulong)bVar19]._M_str;
  }
  __l_11._M_len = 6;
  __l_11._M_array = local_7a8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1e8,__l_11,&local_38);
  psVar13 = &DAT_0015a930;
  pbVar16 = local_748;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    pbVar16->_M_len = *psVar13;
    psVar13 = psVar13 + (ulong)bVar19 * -2 + 1;
    pbVar16 = (basic_string_view<char,_std::char_traits<char>_> *)&pbVar16[-(ulong)bVar19]._M_str;
  }
  __l_12._M_len = 6;
  __l_12._M_array = local_748;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1d0,__l_12,&local_37);
  local_508 = 4;
  pcStack_500 = "+b\na";
  local_518 = 3;
  pcStack_510 = "-ba";
  local_528 = 2;
  pcStack_520 = "+a";
  local_538._M_len = 2;
  local_538._M_str = "^a";
  __l_13._M_len = 4;
  __l_13._M_array = &local_538;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1b8,__l_13,&local_36);
  local_4c8 = 4;
  pcStack_4c0 = "+b\na";
  local_4d8 = 3;
  pcStack_4d0 = "+ba";
  local_4e8 = 4;
  pcStack_4e0 = "+a\nb";
  local_4f8._M_len = 2;
  local_4f8._M_str = "a$";
  __l_14._M_len = 4;
  __l_14._M_array = &local_4f8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1a0,__l_14,&local_35);
  local_3d8 = 4;
  pcStack_3d0 = "+a\nb";
  local_3e8._M_len = 5;
  local_3e8._M_str = "a$\\nb";
  __l_15._M_len = 2;
  __l_15._M_array = &local_3e8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_188,__l_15,&local_34);
  local_3f8 = 4;
  pcStack_3f0 = "+aaa";
  local_408 = 1;
  pcStack_400 = "+";
  local_418._M_len = 1;
  local_418._M_str = "$";
  __l_16._M_len = 3;
  __l_16._M_array = &local_418;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_170,__l_16,&local_33);
  local_488 = 5;
  pcStack_480 = "+aaa\n";
  local_498 = 4;
  pcStack_490 = "-aaa";
  local_4a8 = 1;
  pcStack_4a0 = "+";
  local_4b8._M_len = 2;
  local_4b8._M_str = "^$";
  __l_17._M_len = 4;
  __l_17._M_array = &local_4b8;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_158,__l_17,&local_32);
  __l_18._M_len = 0x13;
  __l_18._M_array = (iterator)local_308;
  std::
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
            *)local_140,__l_18,&local_31);
  lVar8 = 0x1c8;
  do {
    pvVar2 = *(void **)((long)local_320 + lVar8);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)local_320 + lVar8 + 0x10) - (long)pvVar2);
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 0);
  local_60 = cases2.
             super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_140 !=
      (undefined1  [8])
      cases2.
      super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar9 = local_140;
    do {
      local_308._0_8_ = (pointer)0x0;
      local_308._8_8_ = (pointer)0x0;
      local_2f8 = (undefined1  [8])local_c0;
      trivialre::re_compiler::
      C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy>::CompileOrDie
                ((Matcher *)local_368,
                 (C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *)
                 local_308,
                 *(((pointer)auVar9)->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
      pbVar6 = (((pointer)auVar9)->
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar17 = pbVar6->_M_str;
      local_308._0_8_ = local_2f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_308,pcVar17,pcVar17 + pbVar6->_M_len);
      uVar7 = local_308._0_8_;
      cases2.
      super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50 = (pointer)auVar9;
      trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
      CompileOrDie_abi_cxx11_
                ((Matcher *)local_c0,
                 (C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *)
                 &cases2.
                  super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 *(((pointer)auVar9)->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
      printf("testing /%s/ re: %s\n",uVar7,CONCAT71(local_c0._1_7_,local_c0[0]));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_c0._1_7_,local_c0[0]) != local_b0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_c0._1_7_,local_c0[0]),
                        local_b0[0]._M_allocated_capacity + 1);
      }
      pvVar11 = local_50;
      if ((pointer)local_308._0_8_ != (pointer)local_2f8) {
        operator_delete((void *)local_308._0_8_,(ulong)((long)local_2f8 + 1));
      }
      pbVar6 = (pvVar11->
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x10 < (ulong)((long)(pvVar11->
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6)) {
        uVar18 = 1;
        do {
          uVar3 = pbVar6[uVar18]._M_len;
          pcVar17 = pbVar6[uVar18]._M_str;
          printf("trying: %.*s\n",uVar3 & 0xffffffff,pcVar17);
          local_58 = pcVar17;
          if (*pcVar17 == '+') {
            if (uVar3 == 0) {
LAB_0010baa3:
              uVar7 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > __size (which is %zu)",
                                 "basic_string_view::substr",1,0);
              TestBody();
              _Unwind_Resume(uVar7);
            }
            local_308._0_8_ = (pointer)0x0;
            local_308._8_8_ = (pointer)0x0;
            local_2f0.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)std::
                          _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:59:16)>
                          ::_M_invoke;
            local_2f8 = (undefined1  [8])
                        std::
                        _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:59:16)>
                        ::_M_manager;
            sVar10 = uVar3 - 1;
            if (sVar10 == 0) {
              bVar4 = true;
            }
            else {
              bVar4 = true;
              do {
                pcVar17 = pcVar17 + 1;
                __args._M_str = pcVar17;
                __args._M_len = sVar10;
                bVar4 = std::
                        function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                        ::operator()((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                                      *)local_368,__args,bVar4,
                                     (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                                      *)local_308);
                if (bVar4) {
                  iVar5 = (internal)0x1;
                  goto LAB_0010b7c2;
                }
                bVar4 = *pcVar17 == '\n';
                sVar10 = sVar10 - 1;
              } while (sVar10 != 0);
            }
            iVar5 = (internal)
                    std::
                    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                    ::operator()((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                                  *)local_368,
                                 (basic_string_view<char,_std::char_traits<char>_>)
                                 (ZEXT816(0x142b98) << 0x40),bVar4,
                                 (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                                  *)local_308);
LAB_0010b7c2:
            if (local_2f8 != (undefined1  [8])0x0) {
              (*(code *)local_2f8)((string *)local_308,(string *)local_308,3);
            }
            pvVar11 = local_50;
            local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_c0[0] = iVar5;
            if (iVar5 == (internal)0x0) {
              testing::Message::Message
                        ((Message *)
                         &cases2.
                          super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((cases2.
                            super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage,"re: ",4);
              pbVar6 = (pvVar11->
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((cases2.
                            super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar6->_M_str,
                         pbVar6->_M_len);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((cases2.
                            super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage," s: ",4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((cases2.
                            super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage,local_58,uVar3);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_308,(internal *)local_c0,
                         (AssertionResult *)"MatchSubstring(m, s.substr(1))","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                         ,0xaa,(char *)local_308._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_3c8,
                         (Message *)
                         &cases2.
                          super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0010b9d0:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3c8);
              if ((pointer)local_308._0_8_ != (pointer)local_2f8) {
                operator_delete((void *)local_308._0_8_,(ulong)((long)local_2f8 + 1));
              }
              if (cases2.
                  super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                (*(code *)(((cases2.
                             super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_str)();
              }
              if (local_b8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_b8,local_b8);
              }
            }
          }
          else {
            if (uVar3 == 0) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",1,0);
              goto LAB_0010baa3;
            }
            local_308._0_8_ = (pointer)0x0;
            local_308._8_8_ = (pointer)0x0;
            local_2f0.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)std::
                          _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:59:16)>
                          ::_M_invoke;
            local_2f8 = (undefined1  [8])
                        std::
                        _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:59:16)>
                        ::_M_manager;
            sVar10 = uVar3 - 1;
            if (sVar10 == 0) {
              bVar4 = true;
            }
            else {
              bVar4 = true;
              do {
                pcVar17 = pcVar17 + 1;
                __args_00._M_str = pcVar17;
                __args_00._M_len = sVar10;
                bVar4 = std::
                        function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                        ::operator()((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                                      *)local_368,__args_00,bVar4,
                                     (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                                      *)local_308);
                if (bVar4) {
                  bVar4 = true;
                  goto LAB_0010b8ce;
                }
                bVar4 = *pcVar17 == '\n';
                sVar10 = sVar10 - 1;
              } while (sVar10 != 0);
            }
            bVar4 = std::
                    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                    ::operator()((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                                  *)local_368,
                                 (basic_string_view<char,_std::char_traits<char>_>)
                                 (ZEXT816(0x142b98) << 0x40),bVar4,
                                 (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>
                                  *)local_308);
LAB_0010b8ce:
            if (local_2f8 != (undefined1  [8])0x0) {
              (*(code *)local_2f8)((string *)local_308,(string *)local_308,3);
            }
            pvVar11 = local_50;
            local_c0[0] = (internal)(bVar4 ^ 1);
            local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar4 != false) {
              testing::Message::Message
                        ((Message *)
                         &cases2.
                          super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((cases2.
                            super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage,"re: ",4);
              pbVar6 = (pvVar11->
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((cases2.
                            super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar6->_M_str,
                         pbVar6->_M_len);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((cases2.
                            super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage," s: ",4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &((cases2.
                            super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_end_of_storage,local_58,uVar3);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_308,(internal *)local_c0,
                         (AssertionResult *)"MatchSubstring(m, s.substr(1))","true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                         ,0xad,(char *)local_308._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_3c8,
                         (Message *)
                         &cases2.
                          super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              goto LAB_0010b9d0;
            }
          }
          uVar18 = uVar18 + 1;
          pbVar6 = (pvVar11->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar18 < (ulong)((long)(pvVar11->
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6
                                 >> 4));
      }
      if (m.super__Function_base._M_functor._8_8_ != 0) {
        (*(code *)m.super__Function_base._M_functor._8_8_)(local_368,local_368,3);
      }
      auVar9 = (undefined1  [8])(pvVar11 + 1);
    } while (auVar9 != (undefined1  [8])local_60);
  }
  std::
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             *)local_140);
  return;
}

Assistant:

TEST(TrivialRETest, Runnings) {
  // Format is {re, example...}. Each example is prefixed with '+' for
  // must match or '-' for must not.
  std::vector<std::vector<std::string_view>> cases2 = {
      {"a*", "+a", "+", "+not"},
      {"aa*", "+a", "+aaa", "+ba", "-b"},
      {"a+", "+a", "+aa", "+aaa", "-", "-b"},
      {".", "-\n", "+a", "-"},

      {"[a-f]", "+a", "-z", "-", "+f", "--"},
      {"[a-f-]", "+a", "-z", "-", "+f", "+-"},
      {"[az]", "+a", "-b", "+z"},
      {"[^a-f]", "-a", "+z", "-", "-f"},
      {"[^a-f-]", "-a", "+z", "-", "-f", "--"},
      {"[a-f0-9]", "+a", "-z", "+0", "+9"},
      {"[^]", "+a", "+\n"},
      {"", "+", "+asdasd"},

      {"a(b|c+)d", "+abd", "-ab", "-abcd", "+accd", "-ad"},
      {"a(b|c+)?d", "+abd", "-ab", "-abcd", "+accd", "+ad"},

      {"^a", "+a", "-ba", "+b\na"},
      {"a$", "+a\nb", "+ba", "+b\na"},
      {"a$\\nb", "+a\nb"},
      {"$", "+", "+aaa"},
      {"^$", "+", "-aaa", "+aaa\n"},
  };

  for (const auto& vec : cases2) {
    Matcher m = CompileREOrDie(vec[0]);
    printf("testing /%s/ re: %s\n", std::string(vec[0]).c_str(),
           trivialre::re_compiler::C<StringTestingBuilder>({}).CompileOrDie(vec[0])
               .c_str());
    for (size_t i = 1; i < vec.size(); i++) {
      std::string_view s = vec[i];
      printf("trying: %.*s\n", int(s.size()), s.data());
      if (s[0] == '+') {
        EXPECT_TRUE(MatchSubstring(m, s.substr(1))) << "re: " << vec[0] << " s: " << s;
      } else {
        assert(s[0] == '-');
        EXPECT_FALSE(MatchSubstring(m, s.substr(1))) << "re: " << vec[0] << " s: " << s;
      }
    }
  }
}